

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_thread_setaffinity(uv_thread_t *tid,char *cpumask,char *oldmask,size_t mask_size)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  cpu_set_t cpuset;
  
  uVar1 = uv_cpumask_size();
  if (-1 < (int)uVar1) {
    if (mask_size < uVar1) {
      uVar1 = 0xffffffea;
    }
    else {
      if ((oldmask != (char *)0x0) &&
         (iVar2 = uv_thread_getaffinity(tid,oldmask,mask_size), iVar2 < 0)) {
        return iVar2;
      }
      cpuset.__bits[0xe] = 0;
      cpuset.__bits[0xf] = 0;
      cpuset.__bits[0xc] = 0;
      cpuset.__bits[0xd] = 0;
      cpuset.__bits[10] = 0;
      cpuset.__bits[0xb] = 0;
      cpuset.__bits[8] = 0;
      cpuset.__bits[9] = 0;
      cpuset.__bits[6] = 0;
      cpuset.__bits[7] = 0;
      cpuset.__bits[4] = 0;
      cpuset.__bits[5] = 0;
      cpuset.__bits[2] = 0;
      cpuset.__bits[3] = 0;
      cpuset.__bits[0] = 0;
      cpuset.__bits[1] = 0;
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        if ((uVar3 < 0x400) && (cpumask[uVar3] != '\0')) {
          cpuset.__bits[uVar3 >> 6] = cpuset.__bits[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
        }
      }
      iVar2 = pthread_setaffinity_np(*tid,0x80,(cpu_set_t *)&cpuset);
      uVar1 = -iVar2;
    }
  }
  return uVar1;
}

Assistant:

int uv_thread_setaffinity(uv_thread_t* tid,
                          char* cpumask,
                          char* oldmask,
                          size_t mask_size) {
  int i;
  int r;
  uv__cpu_set_t cpuset;
  int cpumasksize;

  cpumasksize = uv_cpumask_size();
  if (cpumasksize < 0)
    return cpumasksize;
  if (mask_size < (size_t)cpumasksize)
    return UV_EINVAL;

  if (oldmask != NULL) {
    r = uv_thread_getaffinity(tid, oldmask, mask_size);
    if (r < 0)
      return r;
  }

  CPU_ZERO(&cpuset);
  for (i = 0; i < cpumasksize; i++)
    if (cpumask[i])
      CPU_SET(i, &cpuset);

#if defined(__ANDROID__)
  if (sched_setaffinity(pthread_gettid_np(*tid), sizeof(cpuset), &cpuset))
    r = errno;
  else
    r = 0;
#else
  r = pthread_setaffinity_np(*tid, sizeof(cpuset), &cpuset);
#endif

  return UV__ERR(r);
}